

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vulnerabilitytobin.cpp
# Opt level: O2

void __thiscall VulnerabilityToBin::~VulnerabilityToBin(VulnerabilityToBin *this)

{
  (this->super_ValidateVulnerability)._vptr_ValidateVulnerability =
       (_func_int **)&PTR_WriteBinVulnerabilityFile_00109d10;
  fclose((FILE *)this->fileOutBin_);
  if ((this->super_ValidateVulnerability).useIndexFile_ == true) {
    fclose((FILE *)this->fileOutIdx_);
  }
  std::_Vector_base<VulnerabilityRow,_std::allocator<VulnerabilityRow>_>::~_Vector_base
            (&(this->vulnerabilityRows_).
              super__Vector_base<VulnerabilityRow,_std::allocator<VulnerabilityRow>_>);
  ValidateVulnerability::~ValidateVulnerability(&this->super_ValidateVulnerability);
  return;
}

Assistant:

VulnerabilityToBin::~VulnerabilityToBin() {

  fclose(fileOutBin_);
  if (useIndexFile_) fclose(fileOutIdx_);

}